

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O2

void burstsort_superalphabet_brodnik(uchar **strings,size_t n)

{
  TrieNode<unsigned_short> *this;
  _func_void_uchar_ptr_ptr_int_int *in_RCX;
  
  this = (TrieNode<unsigned_short> *)operator_new(0x82000);
  TrieNode<unsigned_short>::TrieNode(this);
  insert<32000u,vector_brodnik<unsigned_char*>,BurstSimple<unsigned_short>,unsigned_short>
            (this,strings,n);
  traverse<vector_brodnik<unsigned_char*>,void(*)(unsigned_char**,int,int),unsigned_short>
            (this,strings,0,in_RCX);
  return;
}

Assistant:

void burstsort_superalphabet_brodnik(unsigned char** strings, size_t n)
{
	typedef uint16_t CharT;
	typedef vector_brodnik<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	//typedef BurstRecursive<CharT> BurstImpl;
	TrieNode<CharT>* root = new TrieNode<CharT>;
	insert<32000, BucketT, BurstImpl>(root, strings, n);
	traverse<BucketT>(root, strings, 0, SmallSort);
}